

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_to_storage(secp256k1_fe_storage *r,secp256k1_fe *a)

{
  secp256k1_fe_verify(a);
  if (a->normalized != 0) {
    r->n[0] = a->n[1] << 0x34 | a->n[0];
    r->n[1] = a->n[2] << 0x28 | a->n[1] >> 0xc;
    r->n[2] = a->n[3] << 0x1c | a->n[2] >> 0x18;
    r->n[3] = a->n[4] << 0x10 | a->n[3] >> 0x24;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0x17b,"test condition failed: a->normalized");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_to_storage(secp256k1_fe_storage *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(a->normalized);

    secp256k1_fe_impl_to_storage(r, a);
}